

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_plural(parser *p)

{
  _Bool _Var1;
  void *pvVar2;
  char *pcVar3;
  size_t sVar4;
  char *plural;
  monster_race *r;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"plural");
    if (_Var1) {
      pcVar3 = parser_getstr(p,"plural");
      sVar4 = strlen(pcVar3);
      if (sVar4 == 0) {
        *(undefined8 *)((long)pvVar2 + 0x20) = 0;
      }
      else {
        pcVar3 = string_make(pcVar3);
        *(char **)((long)pvVar2 + 0x20) = pcVar3;
      }
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_plural(struct parser *p)
{
	struct monster_race *r = parser_priv(p);

	if (r == NULL)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	if (parser_hasval(p, "plural")) {
		const char *plural = parser_getstr(p, "plural");

		if (strlen(plural) > 0)
			r->plural = string_make(plural);
		else
			r->plural = NULL;
	}

	return PARSE_ERROR_NONE;
}